

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

FeatureSet * __thiscall
google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::_internal_mutable_fixed_features
          (FeatureSetDefaults_FeatureSetEditionDefault *this)

{
  FeatureSet *pFVar1;
  Arena *arena;
  
  pFVar1 = (this->field_0)._impl_.fixed_features_;
  if (pFVar1 != (FeatureSet *)0x0) {
    return pFVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pFVar1 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(arena);
  (this->field_0)._impl_.fixed_features_ = pFVar1;
  return pFVar1;
}

Assistant:

inline ::google::protobuf::FeatureSet* PROTOBUF_NONNULL FeatureSetDefaults_FeatureSetEditionDefault::_internal_mutable_fixed_features() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.fixed_features_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::FeatureSet>(GetArena());
    _impl_.fixed_features_ = reinterpret_cast<::google::protobuf::FeatureSet*>(p);
  }
  return _impl_.fixed_features_;
}